

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_getuint16(jas_stream_t *in,uint_fast16_t *val)

{
  int iVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = in->flags_;
  if ((uVar4 & 7) != 0) {
    return -1;
  }
  if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
    iVar1 = in->cnt_;
    in->cnt_ = iVar1 + -1;
    if (iVar1 < 1) {
      uVar3 = jas_stream_fillbuf(in,1);
      if (uVar3 == 0xffffffff) {
        return -1;
      }
      uVar4 = in->flags_;
    }
    else {
      in->rwcnt_ = in->rwcnt_ + 1;
      pbVar2 = in->ptr_;
      in->ptr_ = pbVar2 + 1;
      uVar3 = (uint)*pbVar2;
    }
    if ((uVar4 & 7) != 0) {
      return -1;
    }
    if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
      iVar1 = in->cnt_;
      in->cnt_ = iVar1 + -1;
      if (iVar1 < 1) {
        uVar4 = jas_stream_fillbuf(in,1);
        if (uVar4 == 0xffffffff) {
          return -1;
        }
      }
      else {
        in->rwcnt_ = in->rwcnt_ + 1;
        pbVar2 = in->ptr_;
        in->ptr_ = pbVar2 + 1;
        uVar4 = (uint)*pbVar2;
      }
      if (val == (uint_fast16_t *)0x0) {
        return 0;
      }
      *val = (long)(int)uVar4 | (long)(int)uVar3 << 8;
      return 0;
    }
  }
  in->flags_ = uVar4 | 4;
  return -1;
}

Assistant:

int jpc_getuint16(jas_stream_t *in, uint_fast16_t *val)
{
	uint_fast16_t v;
	int c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = (v << 8) | c;
	if (val) {
		*val = v;
	}
	return 0;
}